

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

SerialArena * __thiscall
google::protobuf::internal::ThreadSafeArena::GetSerialArenaFallback(ThreadSafeArena *this,void *me)

{
  long lVar1;
  SerialArena *pSVar2;
  SerialArena *pSVar3;
  SerialArena *pSVar4;
  void *in_RCX;
  long *in_FS_OFFSET;
  bool bVar5;
  Memory MVar6;
  Memory mem;
  
  for (pSVar2 = *(SerialArena **)(this + 0x10); pSVar2 != (SerialArena *)0x0; pSVar2 = pSVar2->next_
      ) {
    if (pSVar2->owner_ == me) goto LAB_0032fd82;
  }
  MVar6 = AllocateMemory((AllocationPolicy *)(*(ulong *)(this + 8) & 0xfffffffffffffff8),0,0x38);
  mem.size = (size_t)me;
  mem.ptr = (void *)MVar6.size;
  pSVar2 = SerialArena::New((SerialArena *)MVar6.ptr,mem,in_RCX);
  pSVar3 = *(SerialArena **)(this + 0x10);
  do {
    pSVar2->next_ = pSVar3;
    LOCK();
    pSVar4 = *(SerialArena **)(this + 0x10);
    bVar5 = pSVar3 == pSVar4;
    if (bVar5) {
      *(SerialArena **)(this + 0x10) = pSVar2;
      pSVar4 = pSVar3;
    }
    UNLOCK();
    pSVar3 = pSVar4;
  } while (!bVar5);
LAB_0032fd82:
  lVar1 = *in_FS_OFFSET;
  *(SerialArena **)(lVar1 + 0x10) = pSVar2;
  *(undefined8 *)(lVar1 + 8) = *(undefined8 *)this;
  *(SerialArena **)(this + 0x18) = pSVar2;
  return pSVar2;
}

Assistant:

PROTOBUF_NOINLINE
SerialArena* ThreadSafeArena::GetSerialArenaFallback(void* me) {
  // Look for this SerialArena in our linked list.
  SerialArena* serial = threads_.load(std::memory_order_acquire);
  for (; serial; serial = serial->next()) {
    if (serial->owner() == me) {
      break;
    }
  }

  if (!serial) {
    // This thread doesn't have any SerialArena, which also means it doesn't
    // have any blocks yet.  So we'll allocate its first block now.
    serial = SerialArena::New(
        AllocateMemory(alloc_policy_.get(), 0, kSerialArenaSize), me);

    SerialArena* head = threads_.load(std::memory_order_relaxed);
    do {
      serial->set_next(head);
    } while (!threads_.compare_exchange_weak(
        head, serial, std::memory_order_release, std::memory_order_relaxed));
  }

  CacheSerialArena(serial);
  return serial;
}